

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
Validator_unfoundUnitsInEncapsulatedComponents_Test::
~Validator_unfoundUnitsInEncapsulatedComponents_Test
          (Validator_unfoundUnitsInEncapsulatedComponents_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, unfoundUnitsInEncapsulatedComponents)
{
    const std::vector<std::string> expectedIssues = {
        "Variable 'v' in component 'c3' has a units reference 'non_existent_deep' which is neither standard nor defined in the parent model.",
        "Variable 'v' in component 'c2' has a units reference 'non_existent_shallow' which is neither standard nor defined in the parent model.",
    };

    libcellml::ModelPtr model = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    libcellml::ComponentPtr c3 = libcellml::Component::create();

    libcellml::ValidatorPtr v = libcellml::Validator::create();

    model->setName("model");
    c1->setName("c1");
    c2->setName("c2");
    c3->setName("c3");

    model->addComponent(c1);
    model->addComponent(c2);
    c2->addComponent(c3);

    c1->addVariable(createVariableWithUnits("v", "dimensionless"));
    c2->addVariable(createVariableWithUnits("v", "non_existent_shallow"));
    c3->addVariable(createVariableWithUnits("v", "non_existent_deep"));

    EXPECT_TRUE(model->hasUnlinkedUnits());

    model->linkUnits();
    v->validateModel(model);

    EXPECT_EQ_ISSUES(expectedIssues, v);
}